

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log4z.cpp
# Opt level: O1

void __thiscall zsummer::log4z::CSem::~CSem(CSem *this)

{
  this->_vptr_CSem = (_func_int **)&PTR__CSem_0014ecc8;
  if (this->m_bCreate == true) {
    this->m_bCreate = false;
    sem_destroy((sem_t *)&this->m_semid);
  }
  operator_delete(this,0x30);
  return;
}

Assistant:

virtual ~CSem()
	{
#ifdef WIN32
		if (m_hSem != NULL)
		{
			CloseHandle(m_hSem);
			m_hSem = NULL;
		}
#else
		if (m_bCreate)
		{
			m_bCreate = false;
			sem_destroy(&m_semid);
		}
#endif
	}